

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

size_type __thiscall
google::
sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
::bucket_size(sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *this,size_type i)

{
  size_type sVar1;
  const_local_iterator local_b0;
  const_local_iterator local_68;
  
  begin(&local_68,this,i);
  end(&local_b0,this,i);
  sVar1 = 1;
  if (((local_68.pos.row_begin._M_current == local_b0.pos.row_begin._M_current) &&
      (local_68.pos.row_end._M_current == local_b0.pos.row_end._M_current)) &&
     (local_68.pos.row_current._M_current == local_b0.pos.row_current._M_current)) {
    if (local_68.pos.row_current._M_current == local_68.pos.row_end._M_current) {
      sVar1 = 0;
    }
    else {
      sVar1 = (size_type)(local_68.pos.col_current != local_b0.pos.col_current);
    }
  }
  return sVar1;
}

Assistant:

size_type bucket_size(size_type i) const {
    return begin(i) == end(i) ? 0 : 1;
  }